

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::SetPixel(Image *image,uint32_t x,uint32_t y,uint8_t value)

{
  bool bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  uchar *puVar5;
  uchar in_CL;
  uint in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  uint uVar6;
  uint uVar7;
  
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RDI);
  uVar6 = in_EDX;
  uVar7 = in_ESI;
  if (!bVar1) {
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
    uVar6 = in_EDX;
    if (in_ESI < uVar3) {
      uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
      if (in_EDX < uVar3) {
        uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
        if (uVar2 == '\x01') {
          puVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
          uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
          puVar5[(ulong)uVar7 + (ulong)(uVar6 * uVar3)] = in_CL;
          return;
        }
      }
    }
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException
            ((imageException *)CONCAT44(uVar7,uVar6),
             (char *)CONCAT17(in_CL,in_stack_ffffffffffffffe8));
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void SetPixel( Image & image, uint32_t x, uint32_t y, uint8_t value )
    {
        if( image.empty() || x >= image.width() || y >= image.height() || image.colorCount() != GRAY_SCALE )
            throw imageException( "Position of point [x, y] is out of image" );

        *(image.data() + y * image.rowSize() + x) = value;
    }